

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManResubPerform_rec(Gia_ResbMan_t *p,int nLimit)

{
  Vec_Int_t **vUnateLits;
  Vec_Int_t **vUnateLitsW;
  Vec_Int_t **vUnatePairs;
  Vec_Int_t **vUnatePairsW;
  word **pSets;
  Vec_Ptr_t *pVVar1;
  Vec_Wec_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  word *pIn2;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  word **ppwVar11;
  Vec_Int_t *pVVar12;
  int w;
  int iVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  int Count;
  uint uVar20;
  
  iVar18 = p->vDivs->nSize;
  if (p->fVerbose != 0) {
    lVar6 = (long)p->nWords;
    if (lVar6 < 1) {
      uVar19 = 0;
      uVar20 = 0;
    }
    else {
      lVar14 = 0;
      uVar19 = 0;
      do {
        uVar16 = p->pSets[0][lVar14] - (p->pSets[0][lVar14] >> 1 & 0x5555555555555555);
        uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
        uVar16 = (uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f;
        uVar16 = (uVar16 >> 8) + uVar16;
        lVar17 = (uVar16 >> 0x10) + uVar16;
        uVar19 = (ulong)((int)uVar19 + ((int)((ulong)lVar17 >> 0x20) + (int)lVar17 & 0xffU));
        lVar14 = lVar14 + 1;
      } while (lVar6 != lVar14);
      lVar14 = 0;
      uVar20 = 0;
      do {
        uVar16 = p->pSets[1][lVar14] - (p->pSets[1][lVar14] >> 1 & 0x5555555555555555);
        uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
        uVar16 = (uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f;
        uVar16 = (uVar16 >> 8) + uVar16;
        lVar17 = (uVar16 >> 0x10) + uVar16;
        uVar20 = uVar20 + ((int)((ulong)lVar17 >> 0x20) + (int)lVar17 & 0xffU);
        lVar14 = lVar14 + 1;
      } while (lVar6 != lVar14);
    }
    printf("      ");
    printf("ISF: ");
    printf("0=%5d (%5.2f %%) ",((double)(int)uVar19 * 100.0) / (double)(p->nWords << 6),uVar19);
    printf("1=%5d (%5.2f %%)  ",((double)(int)uVar20 * 100.0) / (double)(p->nWords << 6),
           (ulong)uVar20);
  }
  lVar6 = (long)p->nWords;
  if (0 < lVar6) {
    pSets = p->pSets;
    lVar14 = 0;
    do {
      if (p->pSets[1][lVar14] != 0) {
        lVar14 = 0;
        while ((*pSets)[lVar14] == 0) {
          lVar14 = lVar14 + 1;
          if (lVar6 == lVar14) {
            return 1;
          }
        }
        vUnateLits = p->vUnateLits;
        ppwVar11 = pSets;
        iVar3 = Gia_ManFindOneUnate(pSets,p->vDivs,p->nWords,vUnateLits,p->vNotUnateVars,p->fVerbose
                                   );
        if (-1 < iVar3) {
          return iVar3;
        }
        if (nLimit == 0) {
          return -1;
        }
        pVVar1 = p->vDivs;
        iVar3 = p->nWords;
        vUnateLitsW = p->vUnateLitsW;
        pVVar2 = p->vSorter;
        Gia_ManSortUnatesInt
                  ((word *)ppwVar11,p->pSets[1],pVVar1,iVar3,p->vUnateLits[0],p->vUnateLitsW[0],
                   pVVar2);
        Gia_ManSortUnatesInt
                  ((word *)ppwVar11,p->pSets[0],pVVar1,iVar3,p->vUnateLits[1],p->vUnateLitsW[1],
                   pVVar2);
        uVar20 = Gia_ManFindTwoUnate(pSets,p->vDivs,p->nWords,vUnateLits,vUnateLitsW,p->fVerbose);
        if ((int)uVar20 < 0) {
          Vec_IntTwoFindCommon
                    ((Vec_Int_t *)(ulong)(uint)p->vNotUnateVars[0]->nSize,
                     (Vec_Int_t *)p->vNotUnateVars[0]->pArray,
                     (Vec_Int_t *)(ulong)(uint)p->vNotUnateVars[1]->nSize);
          uVar9 = p->vBinateVars->nSize;
          uVar20 = p->nDivsMax;
          if ((int)uVar20 < (int)uVar9) {
            p->vBinateVars->nSize = uVar20;
            uVar9 = uVar20;
          }
          if (p->fVerbose != 0) {
            printf("  B = %3d",(ulong)uVar9);
          }
          if ((p->fUseXor == 0) ||
             (uVar20 = Gia_ManFindXor(pSets,p->vDivs,p->nWords,p->vBinateVars,p->vUnatePairs,
                                      p->fVerbose), (int)uVar20 < 0)) {
            if (nLimit == 1) {
              return -1;
            }
            vUnatePairs = p->vUnatePairs;
            ppwVar11 = pSets;
            Gia_ManFindUnatePairs(pSets,p->vDivs,p->nWords,p->vBinateVars,vUnatePairs,p->fVerbose);
            pVVar1 = p->vDivs;
            iVar3 = p->nWords;
            vUnatePairsW = p->vUnatePairsW;
            pVVar2 = p->vSorter;
            Gia_ManSortPairsInt((word *)ppwVar11,p->pSets[1],pVVar1,iVar3,p->vUnatePairs[0],
                                p->vUnatePairsW[0],pVVar2);
            Gia_ManSortPairsInt((word *)ppwVar11,p->pSets[0],pVVar1,iVar3,p->vUnatePairs[1],
                                p->vUnatePairsW[1],pVVar2);
            uVar20 = Gia_ManFindDivGate(pSets,p->vDivs,p->nWords,vUnateLits,vUnatePairs,vUnateLitsW,
                                        vUnatePairsW,p->pDivA);
            if (-1 < (int)uVar20) {
              iVar3 = p->vGates->nSize;
              uVar9 = uVar20 & 1;
              uVar4 = Vec_IntEntry(p->vUnatePairs[uVar9 ^ 1],uVar20 >> 0x11);
              if (-1 < (int)uVar4) {
                iVar18 = iVar3 / 2 + iVar18;
                pVVar12 = p->vGates;
                Vec_IntPush(pVVar12,uVar4 >> 1 & 0x7fff);
                Vec_IntPush(pVVar12,uVar4 >> 0x10);
                if (iVar18 < 0) goto LAB_007a9827;
                pVVar12 = p->vGates;
                iVar3 = ((uVar4 ^ uVar20 >> 0x10) & 1) + iVar18 * 2;
                Vec_IntPush(pVVar12,uVar20 >> 1 & 0x7fff);
LAB_007a93fc:
                Vec_IntPush(pVVar12,iVar3);
                return uVar9 + iVar18 * 2 + 2;
              }
LAB_007a98c2:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((2 < nLimit) &&
               (uVar20 = Gia_ManFindGateGate(pSets,p->vDivs,p->nWords,vUnatePairs,vUnatePairsW,
                                             p->pDivA,p->pDivB), -1 < (int)uVar20)) {
              iVar3 = p->vGates->nSize;
              uVar4 = uVar20 & 1 ^ 1;
              uVar9 = Vec_IntEntry(p->vUnatePairs[uVar4],uVar20 >> 2 & 0x3fff);
              if (((int)uVar9 < 0) ||
                 (uVar4 = Vec_IntEntry(vUnatePairs[uVar4],uVar20 >> 0x11), (int)uVar4 < 0))
              goto LAB_007a98c2;
              iVar18 = iVar3 / 2 + iVar18;
              pVVar12 = p->vGates;
              Vec_IntPush(pVVar12,uVar9 >> 1 & 0x7fff);
              Vec_IntPush(pVVar12,uVar9 >> 0x10);
              pVVar12 = p->vGates;
              Vec_IntPush(pVVar12,uVar4 >> 1 & 0x7fff);
              Vec_IntPush(pVVar12,uVar4 >> 0x10);
              if (-1 < iVar18) {
                pVVar12 = p->vGates;
                Vec_IntPush(pVVar12,((uVar9 ^ uVar20 >> 1) & 1) + iVar18 * 2);
                Vec_IntPush(pVVar12,((uVar4 ^ uVar20 >> 0x10) & 1) + iVar18 * 2 + 2);
                return (uVar20 & 1) + iVar18 * 2 + 4;
              }
              goto LAB_007a9827;
            }
            if (p->vUnateLits[1]->nSize + p->vUnateLits[0]->nSize + p->vUnatePairs[0]->nSize +
                p->vUnatePairs[1]->nSize == 0) {
              return -1;
            }
            iVar5 = 0;
            iVar3 = (*vUnateLitsW)->nSize;
            iVar7 = 0;
            if (iVar3 != 0) {
              if (iVar3 < 1) goto LAB_007a98e1;
              iVar7 = *(*vUnateLitsW)->pArray;
            }
            iVar3 = p->vUnateLitsW[1]->nSize;
            if (iVar3 != 0) {
              if (iVar3 < 1) goto LAB_007a98e1;
              iVar5 = *p->vUnateLitsW[1]->pArray;
            }
            iVar8 = 0;
            iVar3 = (*vUnatePairsW)->nSize;
            iVar10 = 0;
            if (iVar3 != 0) {
              if (iVar3 < 1) goto LAB_007a98e1;
              iVar10 = *(*vUnatePairsW)->pArray;
            }
            iVar3 = p->vUnatePairsW[1]->nSize;
            if (iVar3 != 0) {
              if (iVar3 < 1) goto LAB_007a98e1;
              iVar8 = *p->vUnatePairsW[1]->pArray;
            }
            iVar3 = iVar5;
            if (iVar5 < iVar7) {
              iVar3 = iVar7;
            }
            iVar13 = iVar8;
            if (iVar8 < iVar10) {
              iVar13 = iVar10;
            }
            iVar15 = iVar13;
            if (iVar13 < iVar3) {
              iVar15 = iVar3;
            }
            if (iVar15 == 0) {
              return -1;
            }
            if (iVar3 <= iVar13 / 2) {
              if (nLimit < 3) {
                return -1;
              }
              if (vUnatePairs[iVar10 < iVar8]->nSize < 1) goto LAB_007a98e1;
              uVar20 = *vUnatePairs[iVar10 < iVar8]->pArray;
              if ((int)uVar20 < 0) goto LAB_007a98c2;
              Gia_ManDeriveDivPair(uVar20,p->vDivs,p->nWords,p->pDivA);
              Abc_TtAndSharp(p->pSets[iVar8 <= iVar10],p->pSets[iVar8 <= iVar10],p->pDivA,p->nWords,
                             ~uVar20 & 1);
              if (p->fVerbose != 0) {
                putchar(10);
              }
              uVar4 = Gia_ManResubPerform_rec(p,nLimit + -2);
              if ((int)uVar4 < 0) {
                return -1;
              }
              pVVar12 = p->vGates;
              iVar3 = pVVar12->nSize;
              Vec_IntPush(pVVar12,uVar20 >> 1 & 0x7fff);
              Vec_IntPush(pVVar12,uVar20 >> 0x10);
              iVar18 = iVar3 / 2 + iVar18;
              if (-1 < iVar18) {
                uVar9 = (uint)(iVar8 <= iVar10);
                pVVar12 = p->vGates;
                iVar3 = (~uVar20 & 1) + iVar18 * 2;
                Vec_IntPush(pVVar12,uVar4 ^ uVar9);
                goto LAB_007a93fc;
              }
              goto LAB_007a9827;
            }
            if (nLimit < 2) {
              return -1;
            }
            if (vUnateLits[iVar7 < iVar5]->nSize < 1) {
LAB_007a98e1:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar9 = *vUnateLits[iVar7 < iVar5]->pArray;
            if ((int)uVar9 < 0) goto LAB_007a98c2;
            pIn2 = (word *)Vec_PtrEntry(p->vDivs,uVar9 >> 1);
            Abc_TtAndSharp(p->pSets[iVar5 <= iVar7],p->pSets[iVar5 <= iVar7],pIn2,p->nWords,
                           ~uVar9 & 1);
            if (p->fVerbose != 0) {
              putchar(10);
            }
            uVar4 = Gia_ManResubPerform_rec(p,nLimit + -1);
            if ((int)uVar4 < 0) {
              return -1;
            }
            pVVar12 = p->vGates;
            iVar3 = pVVar12->nSize;
            uVar20 = (uint)(iVar5 <= iVar7);
            Vec_IntPush(pVVar12,uVar9 ^ 1);
            Vec_IntPush(pVVar12,uVar4 ^ uVar20);
            iVar18 = iVar3 / 2 + iVar18;
            if (iVar18 < 0) goto LAB_007a9827;
            goto LAB_007a91bb;
          }
          if ((uVar20 & 2) != 0) {
            __assert_fail("!Abc_LitIsCompl(iDiv0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                          ,0x4c6,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
          }
          if ((uVar20 >> 0x10 & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(iDiv1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                          ,0x4c7,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
          }
          uVar9 = uVar20 >> 1 & 0x7fff;
          if (uVar9 <= uVar20 >> 0x10) {
            __assert_fail("iDiv0 > iDiv1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                          ,0x4c8,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
          }
          pVVar12 = p->vGates;
          iVar3 = pVVar12->nSize;
          Vec_IntPush(pVVar12,uVar9);
          Vec_IntPush(pVVar12,uVar20 >> 0x10);
        }
        else {
          uVar9 = uVar20 >> 1 & 0x7fff;
          if (uVar20 >> 0x10 <= uVar9) {
            __assert_fail("iDiv0 < iDiv1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                          ,0x4b3,"int Gia_ManResubPerform_rec(Gia_ResbMan_t *, int)");
          }
          pVVar12 = p->vGates;
          iVar3 = pVVar12->nSize;
          Vec_IntPush(pVVar12,uVar9);
          Vec_IntPush(pVVar12,uVar20 >> 0x10);
        }
        iVar18 = iVar3 / 2 + iVar18;
        if (iVar18 < 0) {
LAB_007a9827:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar20 = uVar20 & 1;
LAB_007a91bb:
        return uVar20 + iVar18 * 2;
      }
      lVar14 = lVar14 + 1;
    } while (lVar6 != lVar14);
  }
  return 0;
}

Assistant:

int Gia_ManResubPerform_rec( Gia_ResbMan_t * p, int nLimit )
{
    int TopOneW[2] = {0}, TopTwoW[2] = {0}, Max1, Max2, iResLit, nVars = Vec_PtrSize(p->vDivs);
    if ( p->fVerbose )
    {
        int nMints[2] = { Abc_TtCountOnesVec(p->pSets[0], p->nWords), Abc_TtCountOnesVec(p->pSets[1], p->nWords) };
        printf( "      " ); 
        printf( "ISF: " ); 
        printf( "0=%5d (%5.2f %%) ",  nMints[0], 100.0*nMints[0]/(64*p->nWords) );
        printf( "1=%5d (%5.2f %%)  ", nMints[1], 100.0*nMints[1]/(64*p->nWords) );
    }
    if ( Abc_TtIsConst0( p->pSets[1], p->nWords ) )
        return 0;
    if ( Abc_TtIsConst0( p->pSets[0], p->nWords ) )
        return 1;
    iResLit = Gia_ManFindOneUnate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vNotUnateVars, p->fVerbose );
    if ( iResLit >= 0 ) // buffer
        return iResLit;
    if ( nLimit == 0 )
        return -1;
    Gia_ManSortUnates( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnateLitsW, p->vSorter );
    iResLit = Gia_ManFindTwoUnate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnateLitsW, p->fVerbose );
    if ( iResLit >= 0 ) // and
    {
        int iNode = nVars + Vec_IntSize(p->vGates)/2;
        int fComp = Abc_LitIsCompl(iResLit);
        int iDiv0 = Abc_Lit2Var(iResLit) & 0x7FFF;
        int iDiv1 = Abc_Lit2Var(iResLit) >> 15;
        assert( iDiv0 < iDiv1 );
        Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
        return Abc_Var2Lit( iNode, fComp );
    }
    Vec_IntTwoFindCommon( p->vNotUnateVars[0], p->vNotUnateVars[1], p->vBinateVars );
    //return Gia_ManResubPerformMux_rec( p, nLimit );
    if ( Vec_IntSize(p->vBinateVars) > p->nDivsMax )
        Vec_IntShrink( p->vBinateVars, p->nDivsMax );
    if ( p->fVerbose ) printf( "  B = %3d", Vec_IntSize(p->vBinateVars) );
    //Gia_ManSortBinate( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vSorter );
    if ( p->fUseXor )
    {
        iResLit = Gia_ManFindXor( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vUnatePairs, p->fVerbose );
        if ( iResLit >= 0 ) // xor
        {
            int iNode = nVars + Vec_IntSize(p->vGates)/2;
            int fComp = Abc_LitIsCompl(iResLit);
            int iDiv0 = Abc_Lit2Var(iResLit) & 0x7FFF;
            int iDiv1 = Abc_Lit2Var(iResLit) >> 15;
            assert( !Abc_LitIsCompl(iDiv0) );
            assert( !Abc_LitIsCompl(iDiv1) );
            assert( iDiv0 > iDiv1 );
            Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
            return Abc_Var2Lit( iNode, fComp );
        }
    }
    if ( nLimit == 1 )
        return -1;
    Gia_ManFindUnatePairs( p->pSets, p->vDivs, p->nWords, p->vBinateVars, p->vUnatePairs, p->fVerbose );
    Gia_ManSortPairs( p->pSets, p->vDivs, p->nWords, p->vUnatePairs, p->vUnatePairsW, p->vSorter );
    iResLit = Gia_ManFindDivGate( p->pSets, p->vDivs, p->nWords, p->vUnateLits, p->vUnatePairs, p->vUnateLitsW, p->vUnatePairsW, p->pDivA );
    if ( iResLit >= 0 ) // and(div,pair)
    {
        int iNode  = nVars + Vec_IntSize(p->vGates)/2;

        int fComp  = Abc_LitIsCompl(iResLit);
        int iDiv0  = Abc_Lit2Var(iResLit) & 0x7FFF; // div
        int iDiv1  = Abc_Lit2Var(iResLit) >> 15;    // pair

        int Div1   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv1) );
        int fComp1 = Abc_LitIsCompl(Div1) ^ Abc_LitIsCompl(iDiv1);
        int iDiv10 = Abc_Lit2Var(Div1) & 0x7FFF;
        int iDiv11 = Abc_Lit2Var(Div1) >> 15;   

        Vec_IntPushTwo( p->vGates, iDiv10, iDiv11 );
        Vec_IntPushTwo( p->vGates, iDiv0, Abc_Var2Lit(iNode, fComp1) );
        return Abc_Var2Lit( iNode+1, fComp );
    }
//    if ( nLimit == 2 )
//        return -1;
    if ( nLimit >= 3 )
    {
        iResLit = Gia_ManFindGateGate( p->pSets, p->vDivs, p->nWords, p->vUnatePairs, p->vUnatePairsW, p->pDivA, p->pDivB );
        if ( iResLit >= 0 ) // and(pair,pair)
        {
            int iNode  = nVars + Vec_IntSize(p->vGates)/2;

            int fComp  = Abc_LitIsCompl(iResLit);
            int iDiv0  = Abc_Lit2Var(iResLit) & 0x7FFF; // pair
            int iDiv1  = Abc_Lit2Var(iResLit) >> 15;    // pair

            int Div0   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv0) );
            int fComp0 = Abc_LitIsCompl(Div0) ^ Abc_LitIsCompl(iDiv0);
            int iDiv00 = Abc_Lit2Var(Div0) & 0x7FFF;
            int iDiv01 = Abc_Lit2Var(Div0) >> 15;   
        
            int Div1   = Vec_IntEntry( p->vUnatePairs[!fComp], Abc_Lit2Var(iDiv1) );
            int fComp1 = Abc_LitIsCompl(Div1) ^ Abc_LitIsCompl(iDiv1);
            int iDiv10 = Abc_Lit2Var(Div1) & 0x7FFF;
            int iDiv11 = Abc_Lit2Var(Div1) >> 15;   
        
            Vec_IntPushTwo( p->vGates, iDiv00, iDiv01 );
            Vec_IntPushTwo( p->vGates, iDiv10, iDiv11 );
            Vec_IntPushTwo( p->vGates, Abc_Var2Lit(iNode, fComp0), Abc_Var2Lit(iNode+1, fComp1) );
            return Abc_Var2Lit( iNode+2, fComp );
        }
    }
//    if ( nLimit == 3 )
//        return -1;
    if ( Vec_IntSize(p->vUnateLits[0]) + Vec_IntSize(p->vUnateLits[1]) + Vec_IntSize(p->vUnatePairs[0]) + Vec_IntSize(p->vUnatePairs[1]) == 0 )
        return -1;

    TopOneW[0] = Vec_IntSize(p->vUnateLitsW[0]) ? Vec_IntEntry(p->vUnateLitsW[0], 0) : 0;
    TopOneW[1] = Vec_IntSize(p->vUnateLitsW[1]) ? Vec_IntEntry(p->vUnateLitsW[1], 0) : 0;

    TopTwoW[0] = Vec_IntSize(p->vUnatePairsW[0]) ? Vec_IntEntry(p->vUnatePairsW[0], 0) : 0;
    TopTwoW[1] = Vec_IntSize(p->vUnatePairsW[1]) ? Vec_IntEntry(p->vUnatePairsW[1], 0) : 0;

    Max1 = Abc_MaxInt(TopOneW[0], TopOneW[1]);
    Max2 = Abc_MaxInt(TopTwoW[0], TopTwoW[1]);
    if ( Abc_MaxInt(Max1, Max2) == 0 )
        return -1;

    if ( Max1 > Max2/2 )
    {
        if ( nLimit >= 2 && (Max1 == TopOneW[0] || Max1 == TopOneW[1]) )
        {
            int fUseOr  = Max1 == TopOneW[0];
            int iDiv    = Vec_IntEntry( p->vUnateLits[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            word * pDiv = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iDiv) );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], pDiv, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n" ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-1 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                Vec_IntPushTwo( p->vGates, Abc_LitNot(iDiv), Abc_LitNotCond(iResLit, fUseOr) );
                return Abc_Var2Lit( iNode, fUseOr );
            }
        }
        if ( Max2 == 0 )
            return -1;
/*
        if ( Max2 == TopTwoW[0] || Max2 == TopTwoW[1] )
        {
            int fUseOr  = Max2 == TopTwoW[0];
            int iDiv    = Vec_IntEntry( p->vUnatePairs[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            Gia_ManDeriveDivPair( iDiv, p->vDivs, p->nWords, p->pDivA );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], p->pDivA, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n      " ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-2 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;   
                int iDiv1 = Abc_Lit2Var(iDiv) >> 15;      
                Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
                Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iResLit, fUseOr), Abc_Var2Lit(iNode, !fComp) );
                return Abc_Var2Lit( iNode+1, fUseOr );
            }
        }
*/
    }
    else
    {
        if ( nLimit >= 3 && (Max2 == TopTwoW[0] || Max2 == TopTwoW[1]) )
        {
            int fUseOr  = Max2 == TopTwoW[0];
            int iDiv    = Vec_IntEntry( p->vUnatePairs[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            Gia_ManDeriveDivPair( iDiv, p->vDivs, p->nWords, p->pDivA );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], p->pDivA, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n" ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-2 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                int iDiv0 = Abc_Lit2Var(iDiv) & 0x7FFF;   
                int iDiv1 = Abc_Lit2Var(iDiv) >> 15;      
                Vec_IntPushTwo( p->vGates, iDiv0, iDiv1 );
                Vec_IntPushTwo( p->vGates, Abc_LitNotCond(iResLit, fUseOr), Abc_Var2Lit(iNode, !fComp) );
                return Abc_Var2Lit( iNode+1, fUseOr );
            }
        }
        if ( Max1 == 0 )
            return -1;
/*
        if ( Max1 == TopOneW[0] || Max1 == TopOneW[1] )
        {
            int fUseOr  = Max1 == TopOneW[0];
            int iDiv    = Vec_IntEntry( p->vUnateLits[!fUseOr], 0 );
            int fComp   = Abc_LitIsCompl(iDiv);
            word * pDiv = (word *)Vec_PtrEntry( p->vDivs, Abc_Lit2Var(iDiv) );
            Abc_TtAndSharp( p->pSets[fUseOr], p->pSets[fUseOr], pDiv, p->nWords, !fComp );
            if ( p->fVerbose )
                printf( "\n      " ); 
            iResLit = Gia_ManResubPerform_rec( p, nLimit-1 );
            if ( iResLit >= 0 ) 
            {
                int iNode = nVars + Vec_IntSize(p->vGates)/2;
                Vec_IntPushTwo( p->vGates, Abc_LitNot(iDiv), Abc_LitNotCond(iResLit, fUseOr) );
                return Abc_Var2Lit( iNode, fUseOr );
            }
        }
*/
    }
    return -1;
}